

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::EnumNameMethod::EnumNameMethod(EnumNameMethod *this,Builtins *builtins)

{
  SimpleSystemSubroutine *in_RSI;
  undefined8 *in_RDI;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *this_00;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  Type *in_stack_ffffffffffffffd0;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *argTypes;
  pointer requiredArgs;
  pointer ppTVar1;
  
  argTypes = (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)0x0;
  requiredArgs = (pointer)0x0;
  ppTVar1 = (pointer)0x0;
  this_00 = (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
            &stack0xffffffffffffffd8;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)0x936a68
            );
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (in_RSI,(KnownSystemName)((ulong)ppTVar1 >> 0x20),(SubroutineKind)ppTVar1,
             (size_t)requiredArgs,argTypes,in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf
             ,(bool)in_stack_ffffffffffffffce);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector(this_00)
  ;
  *in_RDI = &PTR__EnumNameMethod_00dc5200;
  return;
}

Assistant:

explicit EnumNameMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Name, SubroutineKind::Function, 0, {},
                               builtins.stringType, true) {}